

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::Name,_10UL>::insert
          (UnorderedFixedStorage<wasm::Name,_10UL> *this,Name *x)

{
  Name *pNVar1;
  ulong uVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  
  uVar2 = (this->super_FixedStorageBase<wasm::Name,_10UL>).used;
  if (uVar2 != 0) {
    ppcVar4 = &(this->super_FixedStorageBase<wasm::Name,_10UL>).storage._M_elems[0].super_IString.
               str._M_str;
    uVar5 = uVar2;
    do {
      if (*ppcVar4 == (x->super_IString).str._M_str) {
        return NoError;
      }
      ppcVar4 = ppcVar4 + 2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (10 < uVar2) {
      __assert_fail("this->used <= N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0x3e,
                    "InsertResult wasm::UnorderedFixedStorage<wasm::Name, 10>::insert(const T &) [T = wasm::Name, N = 10]"
                   );
    }
    if (uVar2 == 10) {
      return CouldNotInsert;
    }
  }
  (this->super_FixedStorageBase<wasm::Name,_10UL>).used = uVar2 + 1;
  pcVar3 = (x->super_IString).str._M_str;
  pNVar1 = (this->super_FixedStorageBase<wasm::Name,_10UL>).storage._M_elems + uVar2;
  (pNVar1->super_IString).str._M_len = (x->super_IString).str._M_len;
  (pNVar1->super_IString).str._M_str = pcVar3;
  return NoError;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }